

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

VectorXd __thiscall
Tools::CalculateRMSE
          (Tools *this,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *estimations,
          vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *ground_truth)

{
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar1;
  size_type sVar2;
  size_type sVar3;
  ostream *this_00;
  ulong uVar4;
  MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this_01;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_RCX;
  DenseIndex extraout_RDX;
  DenseIndex extraout_RDX_00;
  DenseIndex DVar5;
  double __x;
  undefined1 auVar6 [16];
  VectorXd VVar7;
  ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_100 [16];
  double local_f0;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8 [16];
  NestedExpressionType local_d8;
  NestedExpressionType local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_b0;
  undefined1 local_98 [8];
  VectorXd residual;
  uint i;
  Scalar local_78;
  Scalar local_70 [3];
  Scalar local_58;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_50;
  undefined1 local_29;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_28;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *ground_truth_local;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *estimations_local;
  Tools *this_local;
  VectorXd *rmse;
  
  local_29 = 0;
  local_28 = in_RCX;
  ground_truth_local = ground_truth;
  estimations_local = estimations;
  this_local = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)this,4);
  local_58 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_50,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this,&local_58);
  local_70[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_50,local_70);
  local_78 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar1,&local_78);
  _i = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar1,(Scalar *)&i);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_50);
  sVar2 = std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(ground_truth_local);
  sVar3 = std::
          vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::size(local_28);
  if ((sVar2 == sVar3) &&
     (sVar2 = std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::size(ground_truth_local), sVar2 != 0)) {
    for (residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
         _0_4_ = 0;
        uVar4 = (ulong)(uint)residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             .m_storage.m_rows,
        sVar2 = std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::size(ground_truth_local), uVar4 < sVar2;
        residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows.
        _0_4_ = (uint)residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows + 1) {
      this_01 = (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::operator[](ground_truth_local,
                             (ulong)(uint)residual.
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_rows);
      other = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              std::
              vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::operator[](local_28,(ulong)(uint)residual.
                                                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                 .m_storage.m_rows);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-(&local_b0,this_01,other);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                ((Matrix<double,_1,1,0,_1,1> *)local_98,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_b0);
      local_d0 = (NestedExpressionType)
                 Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                           ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_98);
      local_d8 = (NestedExpressionType)
                 Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
                           ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_98);
      Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator*
                (&local_c8,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)&local_d0,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 &local_d8);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,_1,1,0,_1,1> *)local_98,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)&local_c8);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_98);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_98);
    }
    sVar2 = std::
            vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(ground_truth_local);
    auVar6._8_4_ = (int)(sVar2 >> 0x20);
    auVar6._0_8_ = sVar2;
    auVar6._12_4_ = 0x45300000;
    local_f0 = (auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/(local_e8,(Scalar *)this);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)this,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_quotient1_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_e8);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::array
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this);
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::sqrt
              (local_100,__x);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)this,
               (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_100);
    DVar5 = extraout_RDX_00;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Invalid estimation or ground_truth data");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    DVar5 = extraout_RDX;
  }
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5;
  VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

VectorXd Tools::CalculateRMSE(const vector<VectorXd> &estimations,
                              const vector<VectorXd> &ground_truth) {
  /**
    * Calculate the RMSE here.
  */

  VectorXd rmse(4);
  rmse << 0,0,0,0;

  // check the validity of the following inputs:
  //  * the estimation vector size should not be zero
  //  * the estimation vector size should equal ground truth vector size
  if(estimations.size() != ground_truth.size() || estimations.size() == 0){
    std::cout << "Invalid estimation or ground_truth data" << std::endl;
    return rmse;
	
  }

  //accumulate squared residuals
  for(unsigned int i=0; i < estimations.size(); ++i){

    VectorXd residual = estimations[i] - ground_truth[i];

//Error display
//std::cout<<"";
//std::cout<<i;
//std::cout<<"~Prediction Error (residual):"<<std::endl;
//std::cout<<residual<<std::endl;
//std::cout<<std::endl;

    //coefficient-wise multiplication
    residual = residual.array()*residual.array();
    rmse += residual;
  }

//calculate the mean
  rmse = rmse/estimations.size();

  //calculate the squared root
  rmse = rmse.array().sqrt();



  /*

// Standard Deviation of predicted value Estiamation
VectorXd sum(4);
sum << 0,0,0,0;
VectorXd mean(4);
mean << 0,0,0,0;
VectorXd stde(4);
stde << 0,0,0,0;

for(unsigned int j=0; j < estimations.size(); j++){

sum = sum + estimations[j];

}

//calculate the mean
mean = sum/estimations.size();

for(unsigned int k=0; k < estimations.size(); k++){

stde = estimations[k] - mean;

    //coefficient-wise multiplication
stde = stde.array()*stde.array();

}

  //calculate the mean
stde = stde/estimations.size();

  //calculate the squared root
stde = stde.array().sqrt();

// Display Std. Deviation
std::cout<<"Std.Deviation (predicted):"<<std::endl;
std::cout<<stde<<std::endl;
std::cout<<std::endl;

// Standard Deviation of ground truth value Estiamation
VectorXd sumg(4);
sumg << 0,0,0,0;
VectorXd meang(4);
meang << 0,0,0,0;
VectorXd stdeg(4);
stdeg << 0,0,0,0;

for(unsigned int j=0; j < estimations.size(); j++){

sumg = sumg + ground_truth[j];

}

//calculate the mean
meang = sumg/estimations.size();

for(unsigned int k=0; k < estimations.size(); k++){

stdeg = estimations[k] - meang;

    //coefficient-wise multiplication
stdeg = stdeg.array()*stdeg.array();

}

  //calculate the mean
stdeg = stdeg/estimations.size();

  //calculate the squared root
stdeg = stdeg.array().sqrt();

// Display Std. Deviation
std::cout<<"Std.Deviation (ground truth):"<<std::endl;
std::cout<<stdeg<<std::endl;
std::cout<<std::endl;
  
*/


//return the result of rmse
  return rmse;
}